

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O0

QString * qt_findAtNxFile(QString *baseFileName,qreal targetDevicePixelRatio,
                         qreal *sourceDevicePixelRatio)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  QString *other;
  int *piVar5;
  QChar *pQVar6;
  ulong uVar7;
  double *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  int n;
  int dotIndex;
  QString atNxfileName;
  QString *in_stack_ffffffffffffff58;
  uint7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QString *this;
  int local_7c;
  int local_64;
  QLatin1Char local_3b;
  char16_t local_3a;
  int local_38;
  int local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  QChar local_12;
  char16_t local_10;
  QChar local_e;
  char16_t local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX != (double *)0x0) {
    *in_RDX = 1.0;
  }
  if (1.0 < in_XMM0_Qa) {
    if ((qt_findAtNxFile(QString_const&,double,double*)::disableNxImageLoading == '\0') &&
       (iVar3 = __cxa_guard_acquire(&qt_findAtNxFile(QString_const&,double,double*)::
                                     disableNxImageLoading), iVar3 != 0)) {
      bVar1 = qEnvironmentVariableIsEmpty("QT_HIGHDPI_DISABLE_2X_IMAGE_LOADING");
      qt_findAtNxFile::disableNxImageLoading = (bool)((bVar1 ^ 0xff) & 1);
      __cxa_guard_release(&qt_findAtNxFile(QString_const&,double,double*)::disableNxImageLoading);
    }
    if ((qt_findAtNxFile::disableNxImageLoading & 1U) == 0) {
      this = in_RSI;
      QChar::QChar<char16_t,_true>(&local_a,L'.');
      qVar4 = QString::lastIndexOf
                        ((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         (QChar)(char16_t)((ulong)this >> 0x30),
                         (CaseSensitivity)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      local_64 = (int)qVar4;
      if (local_64 == -1) {
        qVar4 = QString::size(in_RSI);
        local_64 = (int)qVar4;
      }
      else {
        in_stack_ffffffffffffff67 = false;
        if (1 < local_64) {
          local_c = (char16_t)QString::operator[](this,(ulong)in_stack_ffffffffffffff60);
          QChar::QChar<char16_t,_true>(&local_e,L'9');
          bVar2 = operator==((QChar *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                             (QChar *)in_stack_ffffffffffffff58);
          in_stack_ffffffffffffff67 = false;
          if (bVar2) {
            local_10 = (char16_t)QString::operator[](this,(ulong)in_stack_ffffffffffffff60);
            QChar::QChar<char16_t,_true>(&local_12,L'.');
            in_stack_ffffffffffffff67 =
                 operator==((QChar *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            (QChar *)in_stack_ffffffffffffff58);
          }
        }
        if ((bool)in_stack_ffffffffffffff67 != false) {
          local_64 = local_64 + -2;
        }
      }
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
      other = (QString *)(long)local_64;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)this,CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      QString::insert((longlong)&local_30,(QLatin1String *)other);
      local_34 = qCeil<double>(1.32428071140609e-317);
      local_38 = 9;
      piVar5 = qMin<int>(&local_34,&local_38);
      for (local_7c = *piVar5; 1 < local_7c; local_7c = local_7c + -1) {
        QLatin1Char::QLatin1Char(&local_3b,(char)local_7c + '0');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                   (QLatin1Char)(char)((ulong)this >> 0x38));
        pQVar6 = QString::operator[](other,0x28e699);
        pQVar6->ucs = local_3a;
        uVar7 = QFile::exists((QString *)&local_30);
        if ((uVar7 & 1) != 0) {
          if (in_RDX != (double *)0x0) {
            *in_RDX = (double)local_7c;
          }
          QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                           other);
          goto LAB_0028e70a;
        }
      }
      QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       other);
LAB_0028e70a:
      QString::~QString((QString *)0x28e714);
    }
    else {
      QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    }
  }
  else {
    QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString qt_findAtNxFile(const QString &baseFileName, qreal targetDevicePixelRatio,
                        qreal *sourceDevicePixelRatio)
{
    if (sourceDevicePixelRatio)
        *sourceDevicePixelRatio = 1;
    if (targetDevicePixelRatio <= 1.0)
        return baseFileName;

    static bool disableNxImageLoading = !qEnvironmentVariableIsEmpty("QT_HIGHDPI_DISABLE_2X_IMAGE_LOADING");
    if (disableNxImageLoading)
        return baseFileName;

    int dotIndex = baseFileName.lastIndexOf(u'.');
    if (dotIndex == -1) { /* no dot */
        dotIndex = baseFileName.size(); /* append */
    } else if (dotIndex >= 2 && baseFileName[dotIndex - 1] == u'9'
        && baseFileName[dotIndex - 2] == u'.') {
        // If the file has a .9.* (9-patch image) extension, we must ensure that the @nx goes before it.
        dotIndex -= 2;
    }

    QString atNxfileName = baseFileName;
    atNxfileName.insert(dotIndex, "@2x"_L1);
    // Check for @Nx, ..., @3x, @2x file versions,
    for (int n = qMin(qCeil(targetDevicePixelRatio), 9); n > 1; --n) {
        atNxfileName[dotIndex + 1] = QLatin1Char('0' + n);
        if (QFile::exists(atNxfileName)) {
            if (sourceDevicePixelRatio)
                *sourceDevicePixelRatio = n;
            return atNxfileName;
        }
    }

    return baseFileName;
}